

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceInterpolateAt_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,ShaderFunction function,DataType interpolantDataType,
          DataType secondArgumentDataType)

{
  bool bVar1;
  ContextType ctxType;
  RenderContext *pRVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  char *local_328;
  allocator<char> local_301;
  string local_300;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  string local_298;
  allocator<char> local_271;
  string local_270;
  string local_250;
  byte local_22b;
  byte local_22a;
  allocator<char> local_229;
  string local_228;
  byte local_202;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  undefined1 local_1b0 [8];
  ostringstream source;
  bool supportsES32;
  DataType secondArgumentDataType_local;
  DataType interpolantDataType_local;
  ShaderFunction function_local;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  shaderType_00 = shaderType;
  pRVar2 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  source._372_4_ = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,(ApiType)source._372_4_);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  if (bVar1) {
    local_328 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_328 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  poVar3 = std::operator<<((ostream *)local_1b0,local_328);
  poVar3 = std::operator<<(poVar3,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_1e0,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  local_202 = 0;
  local_22a = 0;
  local_22b = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_202 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"",&local_201);
  }
  else {
    std::allocator<char>::allocator();
    local_22a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"GL_OES_shader_multisample_interpolation",&local_229);
    local_22b = 1;
    NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration(&local_200,&local_228);
  }
  poVar3 = std::operator<<(poVar3,(string *)&local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"interpolant",&local_271);
  NegativeTestShared::anon_unknown_0::declareShaderInput(&local_250,function,&local_270);
  poVar3 = std::operator<<(poVar3,(string *)&local_250);
  poVar3 = std::operator<<(poVar3,"void main()\n");
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_200);
  if ((local_22b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_228);
  }
  if ((local_22a & 1) != 0) {
    std::allocator<char>::~allocator(&local_229);
  }
  if ((local_202 & 1) != 0) {
    std::allocator<char>::~allocator(&local_201);
  }
  std::__cxx11::string::~string((string *)&local_1e0);
  if (shaderType == 0x18) {
    std::operator<<((ostream *)local_1b0,"    interpolateAtCentroid(interpolant);\n");
  }
  else if (shaderType == 0x19) {
    poVar3 = std::operator<<((ostream *)local_1b0,"\tmediump ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"sample",&local_2b9);
    NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
              (&local_298,interpolantDataType,&local_2b8);
    poVar3 = std::operator<<(poVar3,(string *)&local_298);
    std::operator<<(poVar3,"    interpolateAtSample(interpolant, sample);\n");
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
  }
  else if (shaderType == 0x1a) {
    poVar3 = std::operator<<((ostream *)local_1b0,"\tmediump ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"offset",&local_301);
    NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
              (&local_2e0,interpolantDataType,&local_300);
    poVar3 = std::operator<<(poVar3,(string *)&local_2e0);
    std::operator<<(poVar3,"    interpolateAtOffset(interpolant, offset);\n");
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
  }
  std::operator<<((ostream *)local_1b0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceInterpolateAt (NegativeTestContext& ctx, glu::ShaderType shaderType, ShaderFunction function, glu::DataType interpolantDataType, glu::DataType secondArgumentDataType)
{
	DE_ASSERT(function >= SHADER_FUNCTION_INTERPOLATED_AT_CENTROID && function <= SHADER_FUNCTION_INTERPOLATED_AT_OFFSET);

	const bool			supportsES32 = contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	std::ostringstream	source;

	source	<< (supportsES32 ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< (supportsES32 ? "" : getShaderExtensionDeclaration("GL_OES_shader_multisample_interpolation"))
			<< declareShaderInput(interpolantDataType, "interpolant")
			<< "void main()\n"
			<< "{\n";

	switch (function)
	{
		case SHADER_FUNCTION_INTERPOLATED_AT_CENTROID:
			source << "    interpolateAtCentroid(interpolant);\n";
			break;

		case SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE:
			source	<< "	mediump " << declareAndInitializeShaderVariable(secondArgumentDataType, "sample")
					<< "    interpolateAtSample(interpolant, sample);\n";
			break;

		case SHADER_FUNCTION_INTERPOLATED_AT_OFFSET:
			source	<< "	mediump " << declareAndInitializeShaderVariable(secondArgumentDataType, "offset")
					<< "    interpolateAtOffset(interpolant, offset);\n";
			break;

		default:
			DE_FATAL("Unsupported shader function.");
	}

	source << "}\n";

	return source.str();
}